

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  Float FVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001304 [12];
  Tuple3<pbrt::Point3,_float> local_90;
  Tuple3<pbrt::Point3,_float> local_80;
  anon_class_8_1_8991fb9c getMaxDensity;
  Bounds3f bounds;
  
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  (res->super_Tuple3<pbrt::Point3,_int>).x = 4;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 4;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 4;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize(__return_storage_ptr__,0x40)
  ;
  iVar4 = 0;
  iVar3 = 0;
  getMaxDensity.this = this;
  while (iVar4 < (res->super_Tuple3<pbrt::Point3,_int>).z) {
    fVar8 = (float)iVar4;
    iVar4 = iVar4 + 1;
    iVar5 = 0;
    while (iVar5 < (res->super_Tuple3<pbrt::Point3,_int>).y) {
      fVar9 = (float)iVar5;
      iVar5 = iVar5 + 1;
      lVar7 = 0;
      while( true ) {
        uVar1 = (res->super_Tuple3<pbrt::Point3,_int>).x;
        iVar6 = (int)lVar7;
        if ((int)uVar1 <= iVar6) break;
        auVar11._0_4_ = (float)iVar6;
        auVar11._4_12_ = in_register_00001304;
        auVar2 = vpinsrd_avx(ZEXT416(uVar1),(res->super_Tuple3<pbrt::Point3,_int>).y,1);
        auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)fVar9),0x10);
        local_90.z = (float)(res->super_Tuple3<pbrt::Point3,_int>).z;
        auVar2 = vcvtdq2ps_avx(auVar2);
        auVar11 = vdivps_avx(auVar11,auVar2);
        local_80.z = fVar8 / local_90.z;
        local_80._0_8_ = vmovlps_avx(auVar11);
        auVar12._0_4_ = (float)(iVar6 + 1);
        auVar12._4_12_ = in_register_00001304;
        auVar11 = vinsertps_avx(auVar12,ZEXT416((uint)(float)iVar5),0x10);
        auVar2 = vdivps_avx(auVar11,auVar2);
        local_90.z = (float)iVar4 / local_90.z;
        local_90._0_8_ = vmovlps_avx(auVar2);
        Bounds3<float>::Bounds3(&bounds,(Point3<float> *)&local_80,(Point3<float> *)&local_90);
        FVar10 = GetMaxDensityGrid::anon_class_8_1_8991fb9c::operator()(&getMaxDensity,&bounds);
        __return_storage_ptr__->ptr[iVar3 + lVar7] = FVar10;
        lVar7 = lVar7 + 1;
      }
      iVar3 = iVar3 + iVar6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        pstd::vector<Float> maxGrid(alloc);
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(4, 4, 4);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaximumValue(bounds);
            else {
                // Compute maximum density of RGB density over _bounds_
                int nx = rgbDensityGrid->xSize();
                int ny = rgbDensityGrid->ySize();
                int nz = rgbDensityGrid->zSize();
                Point3f ps[2] = {
                    Point3f(bounds.pMin.x * nx - .5f, bounds.pMin.y * ny - .5f,
                            bounds.pMin.z * nz - .5f),
                    Point3f(bounds.pMax.x * nx - .5f, bounds.pMax.y * ny - .5f,
                            bounds.pMax.z * nz - .5f)};
                Point3i pi[2] = {Max(Point3i(Floor(ps[0])), Point3i(0, 0, 0)),
                                 Min(Point3i(Floor(ps[1])) + Vector3i(1, 1, 1),
                                     Point3i(nx - 1, ny - 1, nz - 1))};

                std::vector<SampledWavelengths> lambdas;
                for (Float u : Stratified1D(16))
                    lambdas.push_back(SampledWavelengths::SampleXYZ(u));

                Float maxDensity = 0;
                for (int z = pi[0].z; z <= pi[1].z; ++z)
                    for (int y = pi[0].y; y <= pi[1].y; ++y)
                        for (int x = pi[0].x; x <= pi[1].x; ++x) {
                            RGB rgb = rgbDensityGrid->Lookup(Point3i(x, y, z));

                            Float maxComponent = std::max({rgb.r, rgb.g, rgb.b});
                            if (maxComponent == 0)
                                continue;

                            RGBSpectrum spec(*colorSpace, rgb);
                            for (const SampledWavelengths &lambda : lambdas) {
                                SampledSpectrum s = spec.Sample(lambda);
                                maxDensity = std::max(maxDensity, s.MaxComponentValue());
                            }
                        }

                return maxDensity * 1.025f;
            }
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (int z = 0; z < res->z; ++z)
            for (int y = 0; y < res->y; ++y)
                for (int x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(Float(x) / res->x, Float(y) / res->y, Float(z) / res->z),
                        Point3f(Float(x + 1) / res->x, Float(y + 1) / res->y,
                                Float(z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }